

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O2

int vrna_nucleotide_IUPAC_identity(char nt,char mask)

{
  __int32_t **pp_Var1;
  char cVar2;
  int iVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  char *pcVar5;
  size_t sStack_20;
  
  pp_Var1 = __ctype_toupper_loc();
  iVar3 = (int)(char)(*pp_Var1)[(int)CONCAT71(in_register_00000039,nt)];
  pcVar5 = (char *)0x0;
  if (0x18 < iVar3 - 0x41U) goto switchD_00123c76_caseD_45;
  uVar4 = (*pp_Var1)[(int)CONCAT71(in_register_00000031,mask)];
  cVar2 = (char)uVar4;
  switch(iVar3) {
  case 0x41:
    pcVar5 = "ARMWDHVN";
    break;
  case 0x42:
    pcVar5 = "GCTBU";
    goto LAB_00123ce5;
  case 0x43:
    pcVar5 = "CYMSBHVN";
    break;
  case 0x44:
    pcVar5 = "AGTUD";
    goto LAB_00123ce5;
  default:
    goto switchD_00123c76_caseD_45;
  case 0x47:
    pcVar5 = "GRKSBDVN";
    break;
  case 0x48:
    pcVar5 = "ACTUH";
LAB_00123ce5:
    sStack_20 = 6;
    goto LAB_00123d5f;
  case 0x49:
    if (cVar2 == '\0') {
      sStack_20 = 2;
    }
    else {
      uVar4 = uVar4 & 0xff;
      sStack_20 = 0;
      if (uVar4 != 0x49) {
        pcVar5 = (char *)0x0;
        if (uVar4 != 0x4e) goto switchD_00123c76_caseD_45;
        sStack_20 = 1;
      }
    }
    pcVar5 = "IN" + sStack_20;
    goto switchD_00123c76_caseD_45;
  case 0x4b:
    pcVar5 = "GTUK";
    goto LAB_00123d5d;
  case 0x4d:
    pcVar5 = "ACM";
    goto LAB_00123d4f;
  case 0x4e:
    pcVar5 = "ACGTUN";
    sStack_20 = 7;
    goto LAB_00123d5f;
  case 0x52:
    pcVar5 = "AGR";
    goto LAB_00123d4f;
  case 0x53:
    pcVar5 = "GCS";
LAB_00123d4f:
    sStack_20 = 4;
    goto LAB_00123d5f;
  case 0x54:
    pcVar5 = "TYKWBDHN";
    break;
  case 0x55:
    pcVar5 = "UYKWBDHN";
    break;
  case 0x56:
    pcVar5 = "ACGV";
    goto LAB_00123d5d;
  case 0x57:
    pcVar5 = "ATUW";
    goto LAB_00123d5d;
  case 0x59:
    pcVar5 = "CTUY";
LAB_00123d5d:
    sStack_20 = 5;
    goto LAB_00123d5f;
  }
  sStack_20 = 9;
LAB_00123d5f:
  pcVar5 = (char *)memchr(pcVar5,(int)cVar2,sStack_20);
switchD_00123c76_caseD_45:
  return (int)(pcVar5 != (char *)0x0);
}

Assistant:

PUBLIC int
vrna_nucleotide_IUPAC_identity(char nt,
                               char mask)
{
  char n1, n2, *p;

  p   = NULL;
  n1  = toupper(nt);
  n2  = toupper(mask);

  switch (n1) {
    case 'A':
      p = strchr("ARMWDHVN", n2);
      break;
    case 'C':
      p = strchr("CYMSBHVN", n2);
      break;
    case 'G':
      p = strchr("GRKSBDVN", n2);
      break;
    case 'T':
      p = strchr("TYKWBDHN", n2);
      break;
    case 'U':
      p = strchr("UYKWBDHN", n2);
      break;
    case 'I':
      p = strchr("IN", n2);
      break;
    case 'R':
      p = strchr("AGR", n2);
      break;
    case 'Y':
      p = strchr("CTUY", n2);
      break;
    case 'K':
      p = strchr("GTUK", n2);
      break;
    case 'M':
      p = strchr("ACM", n2);
      break;
    case 'S':
      p = strchr("GCS", n2);
      break;
    case 'W':
      p = strchr("ATUW", n2);
      break;
    case 'B':
      p = strchr("GCTBU", n2);
      break;
    case 'D':
      p = strchr("AGTUD", n2);
      break;
    case 'H':
      p = strchr("ACTUH", n2);
      break;
    case 'V':
      p = strchr("ACGV", n2);
      break;
    case 'N':
      p = strchr("ACGTUN", n2);
      break;
  }

  return (p) ? 1 : 0;
}